

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_create_index.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCreateIndex *op)

{
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true> *this_00;
  SchemaCatalogEntry *this_01;
  pointer pcVar1;
  CatalogTransaction transaction;
  int iVar2;
  pointer pCVar3;
  optional_ptr<duckdb::CatalogEntry,_true> oVar4;
  pointer this_02;
  PhysicalOperator *pPVar5;
  reference this_03;
  pointer pEVar6;
  DatabaseInstance *pDVar7;
  IndexTypeSet *this_04;
  reference this_05;
  type op_00;
  CatalogException *this_06;
  BinderException *pBVar8;
  InternalException *this_07;
  size_type __n;
  PlanIndexInput input;
  optional_ptr<duckdb::IndexType,_true> index_type;
  undefined1 local_c0 [16];
  undefined1 local_b0 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  CatalogTransaction local_58;
  
  this_01 = (op->table->super_StandardEntry).schema;
  SchemaCatalogEntry::GetCatalogTransaction(&local_58,this_01,this->context);
  this_00 = &op->info;
  pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->(this_00);
  transaction.context.ptr = local_58.context.ptr;
  transaction.db.ptr = local_58.db.ptr;
  transaction.transaction.ptr = local_58.transaction.ptr;
  transaction.transaction_id = local_58.transaction_id;
  transaction.start_time = local_58.start_time;
  oVar4 = SchemaCatalogEntry::GetEntry(this_01,transaction,INDEX_ENTRY,&pCVar3->index_name);
  if (oVar4.ptr == (CatalogEntry *)0x0) {
    if ((op->unbound_expressions).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (op->unbound_expressions).
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        this_03 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[](&op->unbound_expressions,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_03);
        iVar2 = (*(pEVar6->super_BaseExpression)._vptr_BaseExpression[0xd])(pEVar6);
        if ((char)iVar2 == '\0') {
          pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
          local_c0._0_8_ = local_c0 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_c0,"Index keys cannot contain expressions with side effects.",
                     "");
          BinderException::BinderException(pBVar8,(string *)local_c0);
          __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(op->unbound_expressions).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(op->unbound_expressions).
                                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->context->db);
    this_04 = DBConfig::GetIndexTypes(&pDVar7->config);
    pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    local_b0._16_8_ = IndexTypeSet::FindByName(this_04,&pCVar3->index_type);
    if ((IndexType *)local_b0._16_8_ == (IndexType *)0x0) {
      pBVar8 = (BinderException *)__cxa_allocate_exception(0x10);
      pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                       ,"Unknown index type: ",&pCVar3->index_type);
      BinderException::BinderException(pBVar8,(string *)local_c0);
      __cxa_throw(pBVar8,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::IndexType,_true>::CheckValid
              ((optional_ptr<duckdb::IndexType,_true> *)(local_b0 + 0x10));
    if (*(index_plan_function_t *)(local_b0._16_8_ + 0x20) == (index_plan_function_t)0x0) {
      this_07 = (InternalException *)__cxa_allocate_exception(0x10);
      local_c0._0_8_ = local_c0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Index type \'%s\' is missing a create_plan function","");
      pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar1 = (pCVar3->index_type)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(local_b0 + 0x18),pcVar1,pcVar1 + (pCVar3->index_type)._M_string_length);
      InternalException::InternalException<std::__cxx11::string>
                (this_07,(string *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_b0 + 0x18));
      __cxa_throw(this_07,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalDependencyList::AddDependency(&this->dependencies,(CatalogEntry *)op->table);
    this_05 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&(op->super_LogicalOperator).children,0);
    op_00 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(this_05);
    local_b0._8_8_ = CreatePlan(this,op_00);
    local_c0._0_8_ = this->context;
    local_c0._8_8_ = op;
    local_b0._0_8_ = this;
    optional_ptr<duckdb::IndexType,_true>::CheckValid
              ((optional_ptr<duckdb::IndexType,_true> *)(local_b0 + 0x10));
    pPVar5 = (**(index_plan_function_t *)(local_b0._16_8_ + 0x20))((PlanIndexInput *)local_c0);
  }
  else {
    pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    if ((pCVar3->super_CreateInfo).on_conflict != IGNORE_ON_CONFLICT) {
      this_06 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_c0._0_8_ = local_c0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"Index with name \"%s\" already exists!","");
      pCVar3 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      pcVar1 = (pCVar3->index_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + (pCVar3->index_name)._M_string_length);
      CatalogException::CatalogException<std::__cxx11::string>(this_06,(string *)local_c0,&local_78)
      ;
      __cxa_throw(this_06,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_02 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(&this->physical_plan);
    pPVar5 = PhysicalPlan::
             Make<duckdb::PhysicalDummyScan,duckdb::vector<duckdb::LogicalType,true>&,unsigned_long&>
                       (this_02,&(op->super_LogicalOperator).types,
                        &(op->super_LogicalOperator).estimated_cardinality);
  }
  return pPVar5;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCreateIndex &op) {
	// Early-out, if the index already exists.
	auto &schema = op.table.schema;
	auto entry = schema.GetEntry(schema.GetCatalogTransaction(context), CatalogType::INDEX_ENTRY, op.info->index_name);
	if (entry) {
		if (op.info->on_conflict != OnCreateConflict::IGNORE_ON_CONFLICT) {
			throw CatalogException("Index with name \"%s\" already exists!", op.info->index_name);
		}
		return Make<PhysicalDummyScan>(op.types, op.estimated_cardinality);
	}

	// Ensure that all expressions contain valid scalar functions.
	// E.g., get_current_timestamp(), random(), and sequence values cannot be index keys.
	for (idx_t i = 0; i < op.unbound_expressions.size(); i++) {
		auto &expr = op.unbound_expressions[i];
		if (!expr->IsConsistent()) {
			throw BinderException("Index keys cannot contain expressions with side effects.");
		}
	}

	// If we get here and the index type is not valid index type, we throw an exception.
	const auto index_type = context.db->config.GetIndexTypes().FindByName(op.info->index_type);
	if (!index_type) {
		throw BinderException("Unknown index type: " + op.info->index_type);
	}
	if (!index_type->create_plan) {
		throw InternalException("Index type '%s' is missing a create_plan function", op.info->index_type);
	}

	// Add a dependency for the entire table on which we create the index.
	dependencies.AddDependency(op.table);
	D_ASSERT(op.info->scan_types.size() - 1 <= op.info->names.size());
	D_ASSERT(op.info->scan_types.size() - 1 <= op.info->column_ids.size());

	// Generate a physical plan for the parallel index creation.
	// TABLE SCAN - PROJECTION - (optional) NOT NULL FILTER - (optional) ORDER BY - CREATE INDEX
	D_ASSERT(op.children.size() == 1);
	auto &plan = CreatePlan(*op.children[0]);

	PlanIndexInput input(context, op, *this, plan);
	return index_type->create_plan(input);
}